

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcpal.c
# Opt level: O0

FT_Error tt_face_palette_set(TT_Face face,FT_UInt palette_index)

{
  void *pvVar1;
  ushort uVar2;
  undefined1 *puVar3;
  FT_Color *pFVar4;
  FT_Byte *pFVar5;
  FT_UShort color_index;
  FT_Color *limit;
  FT_Color *q;
  FT_Byte *p;
  FT_Byte *offset;
  Cpal *cpal;
  FT_UInt palette_index_local;
  TT_Face face_local;
  
  pvVar1 = face->cpal;
  if ((pvVar1 == (void *)0x0) || ((face->palette_data).num_palettes <= palette_index)) {
    face_local._4_4_ = 6;
  }
  else {
    puVar3 = (undefined1 *)(*(long *)((long)pvVar1 + 0x10) + (ulong)(palette_index << 1));
    uVar2 = CONCAT11(*puVar3,puVar3[1]);
    if ((uint)*(ushort *)((long)pvVar1 + 2) <
        (uint)uVar2 + (uint)(face->palette_data).num_palette_entries) {
      face_local._4_4_ = 8;
    }
    else {
      q = (FT_Color *)(*(long *)((long)pvVar1 + 8) + (ulong)uVar2 * 4);
      limit = face->palette;
      pFVar4 = limit + (int)(uint)(face->palette_data).num_palette_entries;
      for (; limit < pFVar4; limit = limit + 1) {
        limit->blue = q->blue;
        limit->green = q->green;
        pFVar5 = &q->alpha;
        limit->red = q->red;
        q = q + 1;
        limit->alpha = *pFVar5;
      }
      face_local._4_4_ = 0;
    }
  }
  return face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_palette_set( TT_Face  face,
                       FT_UInt  palette_index )
  {
    Cpal*  cpal = (Cpal*)face->cpal;

    FT_Byte*   offset;
    FT_Byte*   p;

    FT_Color*  q;
    FT_Color*  limit;

    FT_UShort  color_index;


    if ( !cpal || palette_index >= face->palette_data.num_palettes )
      return FT_THROW( Invalid_Argument );

    offset      = cpal->color_indices + 2 * palette_index;
    color_index = FT_PEEK_USHORT( offset );

    if ( color_index + face->palette_data.num_palette_entries >
           cpal->num_colors )
      return FT_THROW( Invalid_Table );

    p     = cpal->colors + COLOR_SIZE * color_index;
    q     = face->palette;
    limit = q + face->palette_data.num_palette_entries;

    while ( q < limit )
    {
      q->blue  = FT_NEXT_BYTE( p );
      q->green = FT_NEXT_BYTE( p );
      q->red   = FT_NEXT_BYTE( p );
      q->alpha = FT_NEXT_BYTE( p );

      q++;
    }

    return FT_Err_Ok;
  }